

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::Encoding,_char> *b)

{
  Encoding EVar1;
  char local_1f1;
  JSON<char[15],_char> local_1f0;
  char local_1d9;
  JSON<char[15],_char> local_1d8;
  char local_1c1;
  JSON<char[13],_char> local_1c0;
  char local_1a9;
  JSON<char[11],_char> local_1a8;
  char local_191;
  JSON<char[11],_char> local_190;
  char local_179;
  JSON<char[21],_char> local_178;
  char local_161;
  JSON<char[22],_char> local_160;
  char local_149;
  JSON<char[20],_char> local_148;
  char local_131;
  JSON<char[14],_char> local_130;
  char local_119;
  JSON<char[22],_char> local_118;
  char local_101;
  JSON<char[22],_char> local_100;
  char local_e9;
  JSON<char[23],_char> local_e8;
  char local_d1;
  JSON<char[21],_char> local_d0;
  char local_b9;
  JSON<char[16],_char> local_b8;
  char local_a1;
  JSON<char[19],_char> local_a0;
  char local_89;
  JSON<char[14],_char> local_88;
  char local_71;
  JSON<char[13],_char> local_70;
  char local_59;
  JSON<char[21],_char> local_58;
  char local_41;
  JSON<char[15],_char> local_40;
  char local_29;
  JSON<char[15],_char> local_28;
  JSON<pstack::Dwarf::Encoding,_char> *local_18;
  JSON<pstack::Dwarf::Encoding,_char> *b_local;
  ostream *os_local;
  
  EVar1 = *b->object;
  local_18 = b;
  b_local = (JSON<pstack::Dwarf::Encoding,_char> *)os;
  if (EVar1 == DW_ATE_address) {
    local_29 = '\0';
    local_28 = json<char[15],char>((char (*) [15])"DW_ATE_address",&local_29);
    operator<<(os,&local_28);
  }
  else if (EVar1 == DW_ATE_boolean) {
    local_41 = '\0';
    local_40 = json<char[15],char>((char (*) [15])"DW_ATE_boolean",&local_41);
    operator<<(os,&local_40);
  }
  else if (EVar1 == DW_ATE_complex_float) {
    local_59 = '\0';
    local_58 = json<char[21],char>((char (*) [21])"DW_ATE_complex_float",&local_59);
    operator<<(os,&local_58);
  }
  else if (EVar1 == DW_ATE_float) {
    local_71 = '\0';
    local_70 = json<char[13],char>((char (*) [13])"DW_ATE_float",&local_71);
    operator<<(os,&local_70);
  }
  else if (EVar1 == DW_ATE_signed) {
    local_89 = '\0';
    local_88 = json<char[14],char>((char (*) [14])"DW_ATE_signed",&local_89);
    operator<<(os,&local_88);
  }
  else if (EVar1 == DW_ATE_signed_char) {
    local_a1 = '\0';
    local_a0 = json<char[19],char>((char (*) [19])"DW_ATE_signed_char",&local_a1);
    operator<<(os,&local_a0);
  }
  else if (EVar1 == DW_ATE_unsigned) {
    local_b9 = '\0';
    local_b8 = json<char[16],char>((char (*) [16])"DW_ATE_unsigned",&local_b9);
    operator<<(os,&local_b8);
  }
  else if (EVar1 == DW_ATE_unsigned_char) {
    local_d1 = '\0';
    local_d0 = json<char[21],char>((char (*) [21])"DW_ATE_unsigned_char",&local_d1);
    operator<<(os,&local_d0);
  }
  else if (EVar1 == DW_ATE_imaginary_float) {
    local_e9 = '\0';
    local_e8 = json<char[23],char>((char (*) [23])"DW_ATE_imaginary_float",&local_e9);
    operator<<(os,&local_e8);
  }
  else if (EVar1 == DW_ATE_packed_decimal) {
    local_101 = '\0';
    local_100 = json<char[22],char>((char (*) [22])"DW_ATE_packed_decimal",&local_101);
    operator<<(os,&local_100);
  }
  else if (EVar1 == DW_ATE_numeric_string) {
    local_119 = '\0';
    local_118 = json<char[22],char>((char (*) [22])"DW_ATE_numeric_string",&local_119);
    operator<<(os,&local_118);
  }
  else if (EVar1 == DW_ATE_edited) {
    local_131 = '\0';
    local_130 = json<char[14],char>((char (*) [14])"DW_ATE_edited",&local_131);
    operator<<(os,&local_130);
  }
  else if (EVar1 == DW_ATE_signed_fixed) {
    local_149 = '\0';
    local_148 = json<char[20],char>((char (*) [20])"DW_ATE_signed_fixed",&local_149);
    operator<<(os,&local_148);
  }
  else if (EVar1 == DW_ATE_unsigned_fixed) {
    local_161 = '\0';
    local_160 = json<char[22],char>((char (*) [22])"DW_ATE_unsigned_fixed",&local_161);
    operator<<(os,&local_160);
  }
  else if (EVar1 == DW_ATE_decimal_float) {
    local_179 = '\0';
    local_178 = json<char[21],char>((char (*) [21])"DW_ATE_decimal_float",&local_179);
    operator<<(os,&local_178);
  }
  else if (EVar1 == DW_ATE_UTF) {
    local_191 = '\0';
    local_190 = json<char[11],char>((char (*) [11])"DW_ATE_UTF",&local_191);
    operator<<(os,&local_190);
  }
  else if (EVar1 == DW_ATE_UCS) {
    local_1a9 = '\0';
    local_1a8 = json<char[11],char>((char (*) [11])"DW_ATE_UCS",&local_1a9);
    operator<<(os,&local_1a8);
  }
  else if (EVar1 == DW_ATE_ASCII) {
    local_1c1 = '\0';
    local_1c0 = json<char[13],char>((char (*) [13])"DW_ATE_ASCII",&local_1c1);
    operator<<(os,&local_1c0);
  }
  else if (EVar1 == DW_ATE_lo_user) {
    local_1d9 = '\0';
    local_1d8 = json<char[15],char>((char (*) [15])"DW_ATE_lo_user",&local_1d9);
    operator<<(os,&local_1d8);
  }
  else if (EVar1 == DW_ATE_hi_user) {
    local_1f1 = '\0';
    local_1f0 = json<char[15],char>((char (*) [15])"DW_ATE_hi_user",&local_1f1);
    operator<<(os,&local_1f0);
  }
  else {
    std::ostream::operator<<(os,*b->object);
  }
  return (ostream *)b_local;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Dwarf::Encoding> &b)
{
#define DWARF_ATE(enc, val) case Dwarf::enc: os << json(#enc) ; break;

    switch (b.object) {
#include "libpstack/dwarf/encodings.h"
        default: os << int(b.object); break;
    }
    return os;
}